

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_art.hpp
# Opt level: O3

qsbr_value_view __thiscall
unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::get_val
          (iterator *this)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  size_t extraout_RDX;
  long in_RSI;
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *ptr;
  qsbr_value_view qVar4;
  
  lVar3 = *(long *)(in_RSI + 0x38);
  if (lVar3 == *(long *)(in_RSI + 0x18)) {
    __assert_fail("valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                  ,0xa65,
                  "qsbr_value_view unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::get_val() const [Key = unsigned long, Value = std::span<const std::byte>]"
                 );
  }
  if (lVar3 == *(long *)(in_RSI + 0x40)) {
    lVar3 = *(long *)(*(long *)(in_RSI + 0x50) + -8) + 0x200;
  }
  uVar2 = *(ulong *)(lVar3 + -0x20);
  if ((uVar2 & 7) == 0) {
    uVar1 = *(uint *)(uVar2 + 0x1c);
    ptr = (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)
          (uVar2 + *(uint *)(uVar2 + 0x18) + 0x20);
    this->db_ = ptr;
    detail::qsbr_ptr_base::register_active_ptr(ptr);
    (this->stack_).c.
    super__Deque_base<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry,_std::allocator<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::stack_entry>_>
    ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)(ulong)uVar1;
    qVar4.length = extraout_RDX;
    qVar4.start.ptr = (pointer)this;
    return qVar4;
  }
  __assert_fail("node.type() == node_type::LEAF",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/./olc_art.hpp"
                ,0xa68,
                "qsbr_value_view unodb::olc_db<unsigned long, std::span<const std::byte>>::iterator::get_val() const [Key = unsigned long, Value = std::span<const std::byte>]"
               );
}

Assistant:

qsbr_value_view olc_db<Key, Value>::iterator::get_val() const noexcept {
  // Note: If the iterator is on a leaf, we return the value for
  // that leaf regardless of whether the leaf has been deleted.
  // This is part of the design semantics for the OLC ART scan.
  UNODB_DETAIL_ASSERT(valid());  // by contract
  const auto& e = stack_.top();
  const auto& node = e.node;
  UNODB_DETAIL_ASSERT(node.type() == node_type::LEAF);      // On a leaf.
  const auto* const leaf{node.template ptr<leaf_type*>()};  // current leaf.
  return qsbr_ptr_span{leaf->get_value_view()};
}